

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DearchiverBase.cpp
# Opt level: O2

bool __thiscall
Diligent::DearchiverBase::NamedResourceCache<Diligent::IRenderPass>::Get
          (NamedResourceCache<Diligent::IRenderPass> *this,ResourceType Type,char *Name,
          IRenderPass **ppResource)

{
  undefined8 uVar1;
  IRenderPass *pObj;
  iterator iVar2;
  char (*Args_1) [48];
  bool bVar3;
  RefCntAutoPtr<Diligent::IRenderPass> Ptr;
  unique_lock<std::mutex> Lock;
  undefined1 local_58 [32];
  unique_lock<std::mutex> local_38;
  
  if ((Name == (char *)0x0) || (Args_1 = (char (*) [48])ppResource, *Name == '\0')) {
    FormatString<char[26],char[35]>
              ((string *)local_58,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Name != nullptr && Name[0] != \'\\0\'",(char (*) [35])ppResource);
    Args_1 = (char (*) [48])0x97;
    DebugAssertionFailed
              ((Char *)local_58._0_8_,"Get",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
               ,0x97);
    std::__cxx11::string::~string((string *)local_58);
  }
  if ((ppResource == (IRenderPass **)0x0) || (*ppResource != (IRenderPass *)0x0)) {
    FormatString<char[26],char[48]>
              ((string *)local_58,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ppResource != nullptr && *ppResource == nullptr",Args_1);
    DebugAssertionFailed
              ((Char *)local_58._0_8_,"Get",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
               ,0x98);
    std::__cxx11::string::~string((string *)local_58);
  }
  *ppResource = (IRenderPass *)0x0;
  std::unique_lock<std::mutex>::unique_lock(&local_38,&this->m_Mtx);
  DeviceObjectArchive::NamedResourceKey::NamedResourceKey
            ((NamedResourceKey *)local_58,Type,Name,false);
  iVar2 = std::
          _Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::RefCntWeakPtr<Diligent::IRenderPass>_>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::RefCntWeakPtr<Diligent::IRenderPass>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->m_Map)._M_h,(key_type *)local_58);
  HashMapStringKey::Clear((HashMapStringKey *)(local_58 + 8));
  if (iVar2.
      super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::RefCntWeakPtr<Diligent::IRenderPass>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    bVar3 = false;
  }
  else {
    RefCntWeakPtr<Diligent::IRenderPass>::Lock((RefCntWeakPtr<Diligent::IRenderPass> *)local_58);
    uVar1 = local_58._0_8_;
    bVar3 = (IRenderPass *)local_58._0_8_ != (IRenderPass *)0x0;
    if (bVar3) {
      local_58._0_8_ = (IRenderPass *)0x0;
      *ppResource = (IRenderPass *)uVar1;
    }
    RefCntAutoPtr<Diligent::IRenderPass>::Release((RefCntAutoPtr<Diligent::IRenderPass> *)local_58);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_38);
  return bVar3;
}

Assistant:

bool DearchiverBase::NamedResourceCache<ResType>::Get(ResourceType Type, const char* Name, ResType** ppResource)
{
    VERIFY_EXPR(Name != nullptr && Name[0] != '\0');
    VERIFY_EXPR(ppResource != nullptr && *ppResource == nullptr);
    *ppResource = nullptr;

    std::unique_lock<std::mutex> Lock{m_Mtx};

    auto it = m_Map.find(NamedResourceKey{Type, Name});
    if (it == m_Map.end())
        return false;

    auto Ptr = it->second.Lock();
    if (!Ptr)
        return false;

    *ppResource = Ptr.Detach();
    return true;
}